

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_suffix.cc
# Opt level: O2

RegExp * re2c::emit(RangeSuffix *p,RegExp *re)

{
  MatchOp *this;
  Range *m;
  RegExp *pRVar1;
  RegExp *e1;
  
  e1 = re;
  if (p != (RangeSuffix *)0x0) {
    e1 = (RegExp *)0x0;
    for (; p != (RangeSuffix *)0x0; p = p->next) {
      this = (MatchOp *)operator_new(0x10);
      m = Range::ran(p->l,p->h + 1);
      MatchOp::MatchOp(this,m);
      pRVar1 = doCat((RegExp *)this,re);
      pRVar1 = emit(p->child,pRVar1);
      e1 = doAlt(e1,pRVar1);
    }
  }
  return e1;
}

Assistant:

RegExp * emit(RangeSuffix * p, RegExp * re)
{
	if (p == NULL)
		return re;
	else
	{
		RegExp * regexp = NULL;
		for (; p != NULL; p = p->next)
		{
			RegExp * re1 = doCat(new MatchOp(Range::ran (p->l, p->h + 1)), re);
			regexp = doAlt(regexp, emit(p->child, re1));
		}
		return regexp;
	}
}